

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  uint key2_00;
  MemoryManager *pMVar3;
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *this;
  QName *pQVar4;
  XMLCh *key1_00;
  int key2;
  XMLCh *key1;
  SchemaAttDef *data;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 ==
        (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      this = (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x30,pMVar3);
      bVar1 = serEng_local._3_1_;
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
                (this,local_28,(bool)(bVar1 & 1),pMVar3);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (data = (SchemaAttDef *)0x0; data < itemIndex;
        data = (SchemaAttDef *)
               ((long)&(data->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1)) {
      xercesc_4_0::operator>>((XSerializeEngine *)hashModulus,(SchemaAttDef **)&key1);
      pQVar4 = SchemaAttDef::getAttName((SchemaAttDef *)key1);
      key1_00 = QName::getLocalPart(pQVar4);
      pQVar4 = SchemaAttDef::getAttName((SchemaAttDef *)key1);
      key2_00 = QName::getURI(pQVar4);
      RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::put
                (*ppRStack_10,key1_00,key2_00,(SchemaAttDef *)key1);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash2KeysTableOf<SchemaAttDef>** objToLoad
                                   , int
                                   , bool                                toAdopt
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash2KeysTableOf<SchemaAttDef>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            SchemaAttDef*  data;
            serEng>>data;

            XMLCh* key1 = data->getAttName()->getLocalPart();
            int    key2 = data->getAttName()->getURI();
            //key2==data->getId()
            (*objToLoad)->put((void*)key1, key2, data);

        }

    }

}